

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFPageDocumentHelper::flattenAnnotationsForPage
          (QPDFPageDocumentHelper *this,QPDFPageObjectHelper *page,QPDFObjectHandle *resources,
          QPDFAcroFormDocumentHelper *afdh,int required_flags,int forbidden_flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  QPDF *this_00;
  string *psVar2;
  _Atomic_word *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  QPDFPageDocumentHelper *pQVar5;
  QPDFPageObjectHelper *this_02;
  bool bVar6;
  bool bVar7;
  int iVar8;
  longlong lVar9;
  QPDFObjGen og;
  pointer this_03;
  string content;
  string name;
  QPDFObjectHandle as;
  int next_fx;
  QPDFObjectHandle as_resources;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  QPDFObjectHandle rotate_obj;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> annots;
  string new_content;
  string local_220;
  QPDFFormFieldObjectHelper local_200;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [24];
  QPDFObjectHandle local_198;
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  QPDFObjectHandle local_138;
  QPDFObjectHandle local_128;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  QPDFPageDocumentHelper *local_e0;
  QPDFPageObjectHelper *local_d8;
  undefined **local_d0;
  QPDFAcroFormDocumentHelper *local_c8;
  QPDFAnnotationObjectHelper *local_c0;
  QPDFObjectHandle local_b8;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  undefined1 local_88 [24];
  element_type *local_70;
  QPDFAnnotationObjectHelper local_68;
  
  local_188._16_8_ = resources;
  local_188._24_4_ = required_flags;
  local_188._28_4_ = forbidden_flags;
  local_c8 = afdh;
  bVar6 = QPDFAcroFormDocumentHelper::getNeedAppearances(afdh);
  p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&local_200.super_QPDFObjectHelper.super_BaseHandle + 8);
  local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  QPDFPageObjectHelper::getAnnotations(&local_118,page,(string *)&local_200);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
    operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168._16_8_ = 0;
  local_168._24_8_ = 0;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_220._M_dataplus._M_p =
       (pointer)(page->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_220._M_string_length =
       (size_type)
       (page->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length)->
           _M_use_count + 1;
    }
  }
  local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"/Rotate","");
  QPDFObjectHandle::getKey(&local_138,&local_220);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
    operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length);
  }
  bVar7 = QPDFObjectHandle::isInteger(&local_138);
  local_1b0._16_4_ = 0;
  if ((bVar7) && (lVar9 = QPDFObjectHandle::getIntValue(&local_138), lVar9 != 0)) {
    local_1b0._16_4_ = QPDFObjectHandle::getIntValueAsInt(&local_138);
  }
  local_1b0._20_4_ = 1;
  local_c0 = local_118.
             super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = this;
  local_d8 = page;
  if (local_118.
      super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_118.
      super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_220.field_2;
    local_d0 = &PTR__QPDFObjectHelper_002f2ce8;
    this_03 = local_118.
              super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_200.super_QPDFObjectHelper.super_BaseHandle + 8);
      local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"/N","");
      local_220._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
      QPDFAnnotationObjectHelper::getAppearanceStream
                ((QPDFAnnotationObjectHelper *)local_1b0,(string *)this_03,(string *)&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar1) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_((string *)&local_200,this_03);
      iVar8 = std::__cxx11::string::compare((char *)&local_200);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if (iVar8 != 0 || !bVar6) {
        bVar7 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_1b0);
        if (!bVar7) {
          QPDFAnnotationObjectHelper::getAppearanceDictionary
                    ((QPDFAnnotationObjectHelper *)(local_88 + 0x10));
          bVar7 = QPDFObjectHandle::isNull((QPDFObjectHandle *)(local_88 + 0x10));
          bVar7 = !bVar7;
          goto LAB_001d38b1;
        }
        if (iVar8 == 0) {
          local_68.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this_03->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_68.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (this_03->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_68.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_68.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_68.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_68.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this_03->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_68.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (this_03->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_68.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_68.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_68.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_68.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)&PTR__QPDFAnnotationObjectHelper_002f0050;
          local_68.m.
          super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (this_03->m).
                 super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
          local_68.m.
          super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (this_03->m).
               super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_68.m.
              super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68.m.
               super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_68.m.
                    super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68.m.
               super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_68.m.
                    super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          QPDFAcroFormDocumentHelper::getFieldForAnnotation(&local_200,local_c8,&local_68);
          QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_68);
          QPDFObjectHandle::getDict((QPDFObjectHandle *)local_1c8);
          local_220._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Resources","");
          QPDFObjectHandle::getKey(&local_198,(string *)local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != paVar1) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
          }
          bVar7 = QPDFObjectHandle::isIndirect(&local_198);
          if (bVar7) {
            QPDFObjectHandle::getDict((QPDFObjectHandle *)local_1c8);
            local_220._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Resources","");
            QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)local_168);
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)local_1c8,&local_220,(QPDFObjectHandle *)local_168);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar1) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
            }
            QPDFObjectHandle::getDict((QPDFObjectHandle *)local_168);
            local_220._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Resources","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1c8,(string *)local_168);
            this_01._M_pi =
                 local_198.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            local_198.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
            local_198.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_1c8._0_8_;
            local_1c8._0_8_ = (element_type *)0x0;
            local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar1) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
            }
          }
          QPDFFormFieldObjectHelper::getDefaultResources((QPDFFormFieldObjectHelper *)local_88);
          QPDFObjectHandle::mergeResources
                    (&local_198,(QPDFObjectHandle *)local_88,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)0x0);
          if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          if (local_198.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_198.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_200);
        }
        local_220._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"/Fxo","");
        QPDFObjectHandle::getUniqueResourceName
                  ((string *)&local_200,(QPDFObjectHandle *)local_188._16_8_,&local_220,
                   (int *)(local_1b0 + 0x14),
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        QPDFAnnotationObjectHelper::getPageContentForAppearance
                  (&local_220,this_03,(string *)&local_200,local_1b0._16_4_,local_188._24_4_,
                   local_188._28_4_);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator____qpdf((char *)&local_98,0x26b293);
          QPDFObjectHandle::mergeResources
                    ((QPDFObjectHandle *)local_188._16_8_,&local_98,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)0x0);
          if (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          local_198.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_188;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/XObject","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1c8,(string *)local_188._16_8_);
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)local_1c8,(string *)&local_200,
                     (QPDFObjectHandle *)local_1b0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
          }
          if (local_198.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_188) {
            operator_delete(local_198.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)(local_188._0_8_ + 1));
          }
          local_1b0._20_4_ = local_1b0._20_4_ + 1;
        }
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_220._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&local_200.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
          operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
      }
      else {
        bVar7 = false;
LAB_001d38b1:
        if ((iVar8 != 0 || !bVar6) && (local_70 != (element_type *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70);
        }
        if (!bVar7) {
          local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)
               (this_03->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (this_03->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3 = (_Atomic_word *)
                       ((long)&((local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->value).
                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       + 8);
              *p_Var3 = *p_Var3 + 1;
              UNLOCK();
            }
            else {
              p_Var3 = (_Atomic_word *)
                       ((long)&((local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->value).
                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       + 8);
              *p_Var3 = *p_Var3 + 1;
            }
          }
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
          emplace_back<QPDFObjectHandle>
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     (local_168 + 0x10),(QPDFObjectHandle *)&local_200);
          if (local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
      }
      if ((element_type *)local_1b0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
      }
      this_03 = this_03 + 1;
    } while (this_03 != local_c0);
  }
  this_02 = local_d8;
  pQVar5 = local_e0;
  p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&local_200.super_QPDFObjectHelper.super_BaseHandle + 8);
  if ((long)(local_168._24_8_ - local_168._16_8_) >> 4 !=
      ((long)local_118.
             super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_118.
             super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) {
    local_220._M_dataplus._M_p =
         (pointer)(local_d8->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_220._M_string_length =
         (size_type)
         (local_d8->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
    if (local_168._16_8_ == local_168._24_8_) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"/Annots","");
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_220,(string *)&local_200);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"/Annots","");
      QPDFObjectHandle::getKey(&local_198,&local_220);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
        operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      QPDFObjectHandle::newArray
                ((QPDFObjectHandle *)local_1b0,
                 (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_168 + 0x10));
      bVar6 = QPDFObjectHandle::isIndirect(&local_198);
      if (bVar6) {
        this_00 = (pQVar5->super_QPDFDocumentHelper).qpdf;
        og = QPDFObjectHandle::getObjGen(&local_198);
        local_128.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_1b0._0_8_;
        local_128.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_;
        if ((element_type *)local_1b0._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_1b0._8_8_ + 8) = *(_Atomic_word *)(local_1b0._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_1b0._8_8_ + 8) = *(_Atomic_word *)(local_1b0._8_8_ + 8) + 1;
          }
        }
        QPDF::replaceObject(this_00,og,&local_128);
        if ((element_type *)
            local_128.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      else {
        local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"/Annots","");
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)&local_220,(string *)&local_200,(QPDFObjectHandle *)local_1b0
                  );
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
          operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
      }
      if ((element_type *)local_1b0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
      }
      if (local_198.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    psVar2 = (string *)(pQVar5->super_QPDFDocumentHelper).qpdf;
    local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"q\n","");
    QPDF::newStream((QPDF *)&local_a8,psVar2);
    QPDFPageObjectHelper::addPageContents(this_02,&local_a8,true);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
      operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    psVar2 = (string *)(pQVar5->super_QPDFDocumentHelper).qpdf;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200,
                   "\nQ\n",&local_100);
    QPDF::newStream((QPDF *)&local_b8,psVar2);
    QPDFPageObjectHelper::addPageContents(this_02,&local_b8,false);
    if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var4) {
      operator_delete(local_200.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_200.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length);
    }
  }
  if (local_138.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_168 + 0x10));
  std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
            (&local_118);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::flattenAnnotationsForPage(
    QPDFPageObjectHelper& page,
    QPDFObjectHandle& resources,
    QPDFAcroFormDocumentHelper& afdh,
    int required_flags,
    int forbidden_flags)
{
    bool need_appearances = afdh.getNeedAppearances();
    std::vector<QPDFAnnotationObjectHelper> annots = page.getAnnotations();
    std::vector<QPDFObjectHandle> new_annots;
    std::string new_content;
    int rotate = 0;
    QPDFObjectHandle rotate_obj = page.getObjectHandle().getKey("/Rotate");
    if (rotate_obj.isInteger() && rotate_obj.getIntValue()) {
        rotate = rotate_obj.getIntValueAsInt();
    }
    int next_fx = 1;
    for (auto& aoh: annots) {
        QPDFObjectHandle as = aoh.getAppearanceStream("/N");
        bool is_widget = (aoh.getSubtype() == "/Widget");
        bool process = true;
        if (need_appearances && is_widget) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper skip widget need appearances");
            process = false;
        }
        if (process && as.isStream()) {
            if (is_widget) {
                QTC::TC("qpdf", "QPDFPageDocumentHelper merge DR");
                QPDFFormFieldObjectHelper ff = afdh.getFieldForAnnotation(aoh);
                QPDFObjectHandle as_resources = as.getDict().getKey("/Resources");
                if (as_resources.isIndirect()) {
                    QTC::TC("qpdf", "QPDFPageDocumentHelper indirect as resources");
                    as.getDict().replaceKey("/Resources", as_resources.shallowCopy());
                    as_resources = as.getDict().getKey("/Resources");
                }
                as_resources.mergeResources(ff.getDefaultResources());
            } else {
                QTC::TC("qpdf", "QPDFPageDocumentHelper non-widget annotation");
            }
            std::string name = resources.getUniqueResourceName("/Fxo", next_fx);
            std::string content =
                aoh.getPageContentForAppearance(name, rotate, required_flags, forbidden_flags);
            if (!content.empty()) {
                resources.mergeResources("<< /XObject << >> >>"_qpdf);
                resources.getKey("/XObject").replaceKey(name, as);
                ++next_fx;
            }
            new_content += content;
        } else if (process && !aoh.getAppearanceDictionary().isNull()) {
            // If an annotation has no selected appearance stream, just drop the annotation when
            // flattening. This can happen for unchecked checkboxes and radio buttons, popup windows
            // associated with comments that aren't visible, and other types of annotations that
            // aren't visible. Annotations that have no appearance streams at all, such as Link,
            // Popup, and Projection, should be preserved.
            QTC::TC("qpdf", "QPDFPageDocumentHelper ignore annotation with no appearance");
        } else {
            new_annots.push_back(aoh.getObjectHandle());
        }
    }
    if (new_annots.size() != annots.size()) {
        QPDFObjectHandle page_oh = page.getObjectHandle();
        if (new_annots.empty()) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper remove annots");
            page_oh.removeKey("/Annots");
        } else {
            QPDFObjectHandle old_annots = page_oh.getKey("/Annots");
            QPDFObjectHandle new_annots_oh = QPDFObjectHandle::newArray(new_annots);
            if (old_annots.isIndirect()) {
                QTC::TC("qpdf", "QPDFPageDocumentHelper replace indirect annots");
                this->qpdf.replaceObject(old_annots.getObjGen(), new_annots_oh);
            } else {
                QTC::TC("qpdf", "QPDFPageDocumentHelper replace direct annots");
                page_oh.replaceKey("/Annots", new_annots_oh);
            }
        }
        page.addPageContents(qpdf.newStream("q\n"), true);
        page.addPageContents(qpdf.newStream("\nQ\n" + new_content), false);
    }
}